

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O2

void duckdb::HomeDirectorySetting::ResetLocal(ClientContext *context)

{
  ClientConfig *this;
  ClientConfig CStack_1f8;
  
  switchD_014c3389::default(&CStack_1f8,0,0x1e8);
  ClientConfig::ClientConfig(&CStack_1f8);
  this = ClientConfig::GetConfig(context);
  ::std::__cxx11::string::operator=((string *)this,(string *)&CStack_1f8);
  ClientConfig::~ClientConfig(&CStack_1f8);
  return;
}

Assistant:

void HomeDirectorySetting::ResetLocal(ClientContext &context) {
	ClientConfig::GetConfig(context).home_directory = ClientConfig().home_directory;
}